

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::detail::checkIfShouldThrow(Enum at)

{
  int iVar1;
  int iVar2;
  ContextOptions *pCVar3;
  uint in_EDI;
  bool local_1;
  
  if ((in_EDI & 4) == 0) {
    if (((in_EDI & 2) != 0) && (pCVar3 = getContextOptions(), 0 < pCVar3->abort_after)) {
      iVar1 = *(int *)(g_cs + 0x9c);
      iVar2 = MultiLaneAtomic::operator_cast_to_int((MultiLaneAtomic<int> *)0x115c66);
      pCVar3 = getContextOptions();
      if (pCVar3->abort_after <= iVar1 + iVar2) {
        return true;
      }
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool checkIfShouldThrow(assertType::Enum at) {
        if(at & assertType::is_require) //!OCLINT bitwise operator in conditional
            return true;

        if((at & assertType::is_check) //!OCLINT bitwise operator in conditional
           && getContextOptions()->abort_after > 0 &&
           (g_cs->numAssertsFailed + g_cs->numAssertsFailedCurrentTest_atomic) >=
                   getContextOptions()->abort_after)
            return true;

        return false;
    }